

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall
leveldb::Version::GetOverlappingInputs
          (Version *this,int level,InternalKey *begin,InternalKey *end,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs)

{
  pointer *pppFVar1;
  _Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *p_Var2;
  Comparator *pCVar3;
  iterator __position;
  int iVar4;
  pointer ppFVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  Slice file_limit;
  Slice file_start;
  FileMetaData *f;
  Slice local_80;
  Slice local_70;
  FileMetaData *local_60;
  Slice local_58;
  Slice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (level < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x1f6,
                  "void leveldb::Version::GetOverlappingInputs(int, const InternalKey *, const InternalKey *, std::vector<FileMetaData *> *)"
                 );
  }
  if (6 < (uint)level) {
    __assert_fail("level < config::kNumLevels",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x1f7,
                  "void leveldb::Version::GetOverlappingInputs(int, const InternalKey *, const InternalKey *, std::vector<FileMetaData *> *)"
                 );
  }
  ppFVar5 = (inputs->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((inputs->super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar5) {
    (inputs->super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppFVar5;
  }
  local_48 = (Slice)ZEXT816(0xf4aea1);
  local_58 = (Slice)ZEXT816(0xf4aea1);
  if (begin != (InternalKey *)0x0) {
    local_48 = InternalKey::user_key(begin);
  }
  if (end != (InternalKey *)0x0) {
    local_58 = InternalKey::user_key(end);
  }
  ppFVar5 = this->files_[(uint)level].
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (this->files_[(uint)level].
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar5) {
    pCVar3 = (this->vset_->icmp_).user_comparator_;
    p_Var2 = &this->files_[(uint)level].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>;
    uVar6 = 0;
    do {
      local_60 = ppFVar5[uVar6];
      uVar6 = uVar6 + 1;
      local_70 = InternalKey::user_key(&local_60->smallest);
      local_80 = InternalKey::user_key(&local_60->largest);
      if (begin == (InternalKey *)0x0) {
LAB_00cfb310:
        if (end != (InternalKey *)0x0) {
          iVar4 = (*pCVar3->_vptr_Comparator[2])(pCVar3,&local_70,&local_58);
          if (0 < iVar4) goto LAB_00cfb3bd;
        }
        __position._M_current =
             (inputs->
             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (inputs->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
          _M_realloc_insert<leveldb::FileMetaData*const&>
                    ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)inputs
                     ,__position,&local_60);
        }
        else {
          *__position._M_current = local_60;
          pppFVar1 = &(inputs->
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppFVar1 = *pppFVar1 + 1;
        }
        if (level == 0) {
          if (begin == (InternalKey *)0x0) {
LAB_00cfb37b:
            if (end != (InternalKey *)0x0) {
              iVar4 = (*pCVar3->_vptr_Comparator[2])(pCVar3,&local_80,&local_58);
              if (0 < iVar4) {
                local_58 = local_80;
                goto LAB_00cfb3ae;
              }
            }
          }
          else {
            iVar4 = (*pCVar3->_vptr_Comparator[2])(pCVar3,&local_70,&local_48);
            if (-1 < iVar4) goto LAB_00cfb37b;
            local_48 = local_70;
LAB_00cfb3ae:
            ppFVar5 = (inputs->
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if ((inputs->
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                )._M_impl.super__Vector_impl_data._M_finish != ppFVar5) {
              (inputs->
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>)
              ._M_impl.super__Vector_impl_data._M_finish = ppFVar5;
            }
            uVar6 = 0;
          }
        }
      }
      else {
        iVar4 = (*pCVar3->_vptr_Comparator[2])(pCVar3,&local_80,&local_48);
        if (-1 < iVar4) goto LAB_00cfb310;
      }
LAB_00cfb3bd:
      ppFVar5 = (p_Var2->_M_impl).super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(p_Var2->_M_impl).super__Vector_impl_data._M_finish -
                             (long)ppFVar5 >> 3));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Version::GetOverlappingInputs(int level, const InternalKey* begin,
                                   const InternalKey* end,
                                   std::vector<FileMetaData*>* inputs) {
  assert(level >= 0);
  assert(level < config::kNumLevels);
  inputs->clear();
  Slice user_begin, user_end;
  if (begin != nullptr) {
    user_begin = begin->user_key();
  }
  if (end != nullptr) {
    user_end = end->user_key();
  }
  const Comparator* user_cmp = vset_->icmp_.user_comparator();
  for (size_t i = 0; i < files_[level].size();) {
    FileMetaData* f = files_[level][i++];
    const Slice file_start = f->smallest.user_key();
    const Slice file_limit = f->largest.user_key();
    if (begin != nullptr && user_cmp->Compare(file_limit, user_begin) < 0) {
      // "f" is completely before specified range; skip it
    } else if (end != nullptr && user_cmp->Compare(file_start, user_end) > 0) {
      // "f" is completely after specified range; skip it
    } else {
      inputs->push_back(f);
      if (level == 0) {
        // Level-0 files may overlap each other.  So check if the newly
        // added file has expanded the range.  If so, restart search.
        if (begin != nullptr && user_cmp->Compare(file_start, user_begin) < 0) {
          user_begin = file_start;
          inputs->clear();
          i = 0;
        } else if (end != nullptr &&
                   user_cmp->Compare(file_limit, user_end) > 0) {
          user_end = file_limit;
          inputs->clear();
          i = 0;
        }
      }
    }
  }
}